

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ResolveExprNames(NameContext *pNC,Expr *pExpr)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  Walker w;
  Walker local_50;
  
  if (pExpr != (Expr *)0x0) {
    uVar1 = pNC->ncFlags;
    pNC->ncFlags = uVar1 & 0x6fef;
    local_50.pParse = pNC->pParse;
    local_50.xExprCallback = resolveExprStep;
    local_50.xSelectCallback = resolveSelectStep;
    local_50.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    iVar3 = (local_50.pParse)->nHeight + pExpr->nHeight;
    (local_50.pParse)->nHeight = iVar3;
    local_50.u.pNC = pNC;
    if ((local_50.pParse)->db->aLimit[3] < iVar3) {
      sqlite3ErrorMsg(local_50.pParse,"Expression tree is too large (maximum depth %d)");
      uVar4 = 1;
    }
    else {
      walkExpr(&local_50,pExpr);
      (local_50.pParse)->nHeight = (local_50.pParse)->nHeight - pExpr->nHeight;
      uVar2 = pNC->ncFlags;
      pExpr->flags = pExpr->flags | uVar2 & 0x8010;
      pNC->ncFlags = uVar1 & 0x9010 | uVar2;
      uVar4 = 1;
      if (pNC->nErr < 1) {
        uVar4 = (uint)(0 < (local_50.pParse)->nErr);
      }
    }
    return uVar4;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveExprNames( 
  NameContext *pNC,       /* Namespace to resolve expressions in. */
  Expr *pExpr             /* The expression to be analyzed. */
){
  u16 savedHasAgg;
  Walker w;

  if( pExpr==0 ) return SQLITE_OK;
  savedHasAgg = pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg|NC_HasWin);
  pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg|NC_HasWin);
  w.pParse = pNC->pParse;
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.u.pNC = pNC;
#if SQLITE_MAX_EXPR_DEPTH>0
  w.pParse->nHeight += pExpr->nHeight;
  if( sqlite3ExprCheckHeight(w.pParse, w.pParse->nHeight) ){
    return SQLITE_ERROR;
  }
#endif
  sqlite3WalkExpr(&w, pExpr);
#if SQLITE_MAX_EXPR_DEPTH>0
  w.pParse->nHeight -= pExpr->nHeight;
#endif
  assert( EP_Agg==NC_HasAgg );
  assert( EP_Win==NC_HasWin );
  testcase( pNC->ncFlags & NC_HasAgg );
  testcase( pNC->ncFlags & NC_HasWin );
  ExprSetProperty(pExpr, pNC->ncFlags & (NC_HasAgg|NC_HasWin) );
  pNC->ncFlags |= savedHasAgg;
  return pNC->nErr>0 || w.pParse->nErr>0;
}